

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O1

TransactionController * __thiscall
cfd::api::TransactionApi::UpdateWitnessStack
          (TransactionController *__return_storage_ptr__,TransactionApi *this,string *tx_hex,
          Txid *txid,uint32_t vout,SignParameter *update_sign_param,uint32_t stack_index)

{
  function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_object = CreateController;
  local_28._M_invoker =
       std::
       _Function_handler<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cfd::TransactionController_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_cfd::TransactionController_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  TransactionApiBase::UpdateWitnessStack<cfd::TransactionController>
            (__return_storage_ptr__,&local_28,tx_hex,txid,vout,update_sign_param,stack_index);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

TransactionController TransactionApi::UpdateWitnessStack(
    const std::string& tx_hex, const Txid& txid, const uint32_t vout,
    const SignParameter& update_sign_param, uint32_t stack_index) const {
  return TransactionApiBase::UpdateWitnessStack<TransactionController>(
      cfd::api::CreateController, tx_hex, txid, vout, update_sign_param,
      stack_index);
}